

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelConnects::IfcRelConnects(IfcRelConnects *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcRoot::IfcRoot((IfcRoot *)this,vtt + 2);
  pvVar1 = vtt[6];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x88 = pvVar1;
  *(void **)(&(this->super_IfcRelationship).super_IfcRoot.field_0x88 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[7];
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_IfcRelationship).super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcRelationship).super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var2[-3]) = vtt[8];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x88 = vtt[9];
  pvVar1 = vtt[10];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x98 = pvVar1;
  *(void **)(&(this->super_IfcRelationship).super_IfcRoot.field_0x98 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0xb];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcRelationship).super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcRelationship).super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var2[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x88 = vtt[0xd];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x98 = vtt[0xe];
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}